

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void get_top_weights<sparse_parameters>
               (vw *all,int top_words_count,int topic,
               vector<feature,_std::allocator<feature>_> *output,sparse_parameters *weights)

{
  undefined8 *puVar1;
  float fVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t i;
  pointer pfVar5;
  pointer pfVar6;
  _Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> __tmp;
  __node_base *p_Var7;
  int iVar8;
  pointer pfVar9;
  bool bVar10;
  anon_class_1_0_00000001 cmp;
  _Vector_base<feature,_std::allocator<feature>_> local_78;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  top_features;
  
  pfVar9 = (pointer)(1L << ((byte)all->num_bits & 0x3f));
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
  ::priority_queue(&top_features,&cmp,(vector<feature,_std::allocator<feature>_> *)&local_78);
  std::_Vector_base<feature,_std::allocator<feature>_>::~_Vector_base(&local_78);
  p_Var7 = &(weights->_map)._M_h._M_before_begin;
  pfVar5 = (pointer)(long)top_words_count;
  pfVar6 = pfVar9;
  if (pfVar5 < pfVar9) {
    pfVar6 = pfVar5;
  }
  while( true ) {
    p_Var7 = p_Var7->_M_nxt;
    bVar10 = pfVar6 == (pointer)0x0;
    pfVar6 = (pointer)((long)&pfVar6[-1].weight_index + 7);
    if (bVar10) break;
    local_78._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(p_Var7 + 1);
    local_78._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)
                            ((long)&(*(_Hash_node_base **)
                                      &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor)->
                                    _M_nxt + (long)topic * 4));
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
    ::push(&top_features,(value_type *)&local_78);
  }
  for (; pfVar5 < pfVar9; pfVar5 = (pointer)((long)&pfVar5->x + 1)) {
    fVar2 = *(float *)((long)&(*(_Hash_node_base **)
                                &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor)->_M_nxt
                      + (long)topic * 4);
    if ((top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
         super__Vector_impl_data._M_start)->x <= fVar2 &&
        fVar2 != (top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                  super__Vector_impl_data._M_start)->x) {
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
      ::pop(&top_features);
      local_78._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,fVar2);
      local_78._M_impl.super__Vector_impl_data._M_finish = pfVar5;
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
      ::push(&top_features,(value_type *)&local_78);
    }
    p_Var7 = p_Var7->_M_nxt;
  }
  std::vector<feature,_std::allocator<feature>_>::resize
            (output,(long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 4);
  iVar8 = (int)((ulong)((long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4) + 1;
  uVar4 = (long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                super__Vector_impl_data._M_start & 0xffffffff0;
  while( true ) {
    iVar8 = iVar8 + -1;
    if (iVar8 < 1) break;
    uVar3 = (top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
             super__Vector_impl_data._M_start)->weight_index;
    puVar1 = (undefined8 *)
             ((long)&(output->super__Vector_base<feature,_std::allocator<feature>_>)._M_impl.
                     super__Vector_impl_data._M_start[-1].x + uVar4);
    *puVar1 = *(undefined8 *)
               top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
               super__Vector_impl_data._M_start;
    puVar1[1] = uVar3;
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
    ::pop(&top_features);
    uVar4 = uVar4 - 0x10;
  }
  std::_Vector_base<feature,_std::allocator<feature>_>::~_Vector_base
            ((_Vector_base<feature,_std::allocator<feature>_> *)&top_features);
  return;
}

Assistant:

void get_top_weights(vw *all, int top_words_count, int topic, std::vector<feature> &output, T &weights)
{
  uint64_t length = (uint64_t)1 << all->num_bits;

  // get top features for this topic
  auto cmp = [](feature left, feature right) { return left.x > right.x; };
  std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
  typename T::iterator iter = weights.begin();

  for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
    top_features.push({(&(*iter))[topic], iter.index()});

  for (uint64_t i = top_words_count; i < length; i++, ++iter)
  {
    weight v = (&(*iter))[topic];
    if (v > top_features.top().x)
    {
      top_features.pop();
      top_features.push({v, i});
    }
  }

  // extract idx and sort descending
  output.resize(top_features.size());
  for (int i = (int)top_features.size() - 1; i >= 0; i--)
  {
    output[i] = top_features.top();
    top_features.pop();
  }
}